

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_cost_enc.c
# Opt level: O3

void InsertInterval(CostManager *manager,CostInterval *interval_in,int64_t cost,int position,
                   int start,int end)

{
  int64_t *piVar1;
  CostInterval *pCVar2;
  CostInterval *pCVar3;
  long lVar4;
  CostInterval **ppCVar5;
  CostManager *pCVar6;
  int iVar7;
  CostInterval *pCVar8;
  
  if (end <= start) {
    return;
  }
  if (499 < manager->count_) {
    piVar1 = manager->costs_;
    lVar4 = (long)start;
    iVar7 = start - position;
    do {
      iVar7 = iVar7 + 1;
      if (cost < piVar1[lVar4]) {
        piVar1[lVar4] = cost;
        manager->dist_array_[lVar4] = (uint16_t)iVar7;
      }
      lVar4 = lVar4 + 1;
    } while (end != lVar4);
    return;
  }
  pCVar3 = manager->free_intervals_;
  if (pCVar3 == (CostInterval *)0x0) {
    pCVar3 = manager->recycled_intervals_;
    if (pCVar3 == (CostInterval *)0x0) {
      pCVar3 = (CostInterval *)WebPSafeMalloc(1,0x28);
      if (pCVar3 == (CostInterval *)0x0) {
        piVar1 = manager->costs_;
        lVar4 = (long)start;
        iVar7 = start - position;
        do {
          iVar7 = iVar7 + 1;
          if (cost < piVar1[lVar4]) {
            piVar1[lVar4] = cost;
            manager->dist_array_[lVar4] = (uint16_t)iVar7;
          }
          lVar4 = lVar4 + 1;
        } while (end != lVar4);
        return;
      }
      goto LAB_0014e0fb;
    }
    ppCVar5 = &manager->recycled_intervals_;
  }
  else {
    ppCVar5 = &manager->free_intervals_;
  }
  *ppCVar5 = pCVar3->next_;
LAB_0014e0fb:
  pCVar3->cost_ = cost;
  pCVar3->index_ = position;
  pCVar3->start_ = start;
  pCVar3->end_ = end;
  if (interval_in != (CostInterval *)0x0) goto LAB_0014e15f;
  for (interval_in = manager->head_; interval_in != (CostInterval *)0x0;
      interval_in = interval_in->previous_) {
LAB_0014e15f:
    if (interval_in->start_ <= start) goto LAB_0014e16e;
  }
  interval_in = (CostInterval *)0x0;
LAB_0014e16e:
  do {
    pCVar8 = interval_in;
    if (pCVar8 == (CostInterval *)0x0) {
      pCVar2 = manager->head_;
      pCVar3->next_ = pCVar2;
      pCVar6 = manager;
      if (pCVar2 != (CostInterval *)0x0) {
        pCVar2->previous_ = pCVar3;
      }
      goto LAB_0014e1b7;
    }
    interval_in = pCVar8->next_;
    if (interval_in == (CostInterval *)0x0) {
      pCVar3->next_ = (CostInterval *)0x0;
      pCVar6 = (CostManager *)&pCVar8->next_;
      goto LAB_0014e1b7;
    }
    if (start <= interval_in->start_) {
      pCVar3->next_ = interval_in;
      interval_in->previous_ = pCVar3;
      pCVar6 = (CostManager *)&pCVar8->next_;
LAB_0014e1b7:
      pCVar6->head_ = pCVar3;
      pCVar3->previous_ = pCVar8;
      manager->count_ = manager->count_ + 1;
      return;
    }
  } while( true );
}

Assistant:

static WEBP_INLINE void InsertInterval(CostManager* const manager,
                                       CostInterval* const interval_in,
                                       int64_t cost, int position, int start,
                                       int end) {
  CostInterval* interval_new;

  if (start >= end) return;
  if (manager->count_ >= COST_CACHE_INTERVAL_SIZE_MAX) {
    // Serialize the interval if we cannot store it.
    UpdateCostPerInterval(manager, start, end, position, cost);
    return;
  }
  if (manager->free_intervals_ != NULL) {
    interval_new = manager->free_intervals_;
    manager->free_intervals_ = interval_new->next_;
  } else if (manager->recycled_intervals_ != NULL) {
    interval_new = manager->recycled_intervals_;
    manager->recycled_intervals_ = interval_new->next_;
  } else {  // malloc for good
    interval_new = (CostInterval*)WebPSafeMalloc(1, sizeof(*interval_new));
    if (interval_new == NULL) {
      // Write down the interval if we cannot create it.
      UpdateCostPerInterval(manager, start, end, position, cost);
      return;
    }
  }

  interval_new->cost_ = cost;
  interval_new->index_ = position;
  interval_new->start_ = start;
  interval_new->end_ = end;
  PositionOrphanInterval(manager, interval_new, interval_in);

  ++manager->count_;
}